

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_custom_callback2(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  int *piVar6;
  cargo_t cargo;
  _test_data_t data;
  int b;
  int *local_f00;
  char *args [4];
  char title [256];
  char optname [256];
  char grpname [256];
  int vals [31] [24];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    b = 0;
    args[2] = "--alpha";
    args[3] = "128x64";
    args[0] = "program";
    args[1] = "--beta";
    cargo_set_flags(cargo,CARGO_AUTOCLEAN);
    iVar1 = cargo_add_option(cargo,0,"--alpha","The alpha","c",_test_cb,&data);
    iVar2 = cargo_add_option(cargo,0,"--beta","The beta","b",&b);
    if (iVar2 == 0 && iVar1 == 0) {
      piVar6 = vals[0];
      lVar3 = 0;
      while (lVar3 != 0x1f) {
        lVar3 = lVar3 + 1;
        cargo_snprintf(grpname,0x100,"group%d",lVar3);
        cargo_snprintf(title,0x100,"The Group%d",lVar3);
        iVar1 = cargo_add_group(cargo,0,grpname,title,"Group");
        if (iVar1 != 0) {
          pcVar5 = "Failed to add group";
          goto LAB_0011528f;
        }
        lVar4 = 1;
        local_f00 = piVar6;
        while (lVar4 != 0x19) {
          cargo_snprintf(optname,0x100,"--optg%02do%02d",lVar3,lVar4);
          iVar1 = cargo_add_option(cargo,0,optname,
                                   "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Ut enim ad minim veniam, quis nostrud exercitation ullamco laboris nisi ut aliquip ex ea commodo consequat. Duis aute irure dolor in reprehenderit in voluptate velit esse cillum dolore eu fugiat nulla pariatur. Excepteur sint occaecat cupidatat non proident, sunt in culpa qui officia deserunt mollit anim id est laborum."
                                   ,"i",piVar6);
          iVar2 = cargo_group_add_option(cargo,grpname,optname);
          lVar4 = lVar4 + 1;
          piVar6 = piVar6 + 1;
          if (iVar2 != 0 || iVar1 != 0) {
            pcVar5 = "Failed to add option";
            goto LAB_0011528f;
          }
        }
        piVar6 = local_f00 + 0x18;
      }
      cargo_parse(cargo,0,1,4,args);
      printf("%dx%d\n",(ulong)(uint)data.width,(ulong)(uint)data.height);
      pcVar5 = "Width expected to be 128";
      if (data.width == 0x80) {
        if (data.height == 0x40) {
          if (b == 1) {
            cargo_parse(cargo,0,1,4,args);
            printf("%dx%d\n",(ulong)(uint)data.width,(ulong)(uint)data.height);
            if (((data.width == 0x80) && (pcVar5 = "Height expected to be 128", data.height == 0x40)
                ) && (pcVar5 = (char *)0x0, b != 1)) {
              pcVar5 = "Expected b == 1";
            }
          }
          else {
            pcVar5 = "Expected b == 1";
          }
        }
        else {
          pcVar5 = "Height expected to be 128";
        }
      }
    }
    else {
      pcVar5 = "Failed to add options";
    }
LAB_0011528f:
    cargo_destroy(&cargo);
  }
  else {
    pcVar5 = "Failed to init cargo";
  }
  return pcVar5;
}

Assistant:

_TEST_START(TEST_custom_callback2)
{
    _test_data_t data;
    int b = 0;

    #define GROUP_COUNT (CARGO_DEFAULT_MAX_GROUPS * 8 - 1)
    #define GROUP_OPT_COUNT (CARGO_DEFAULT_MAX_GROUP_OPTS * 3)
    int vals[GROUP_COUNT][GROUP_OPT_COUNT];
    char grpname[256];
    char title[256];
    char optname[256];
    size_t i;
    size_t j;
    char *args[] = { "program", "--beta", "--alpha", "128x64" };

    cargo_set_flags(cargo, CARGO_AUTOCLEAN);

    // Add a custom argument
    ret |= cargo_add_option(cargo, 0, "--alpha", "The alpha", "c", _test_cb, &data);

    ret |= cargo_add_option(cargo, 0, "--beta", "The beta", "b", &b);
    cargo_assert(ret == 0, "Failed to add options");

    // Add many groups. We do this to trigger a reallocation.
    for (i = 0; i < GROUP_COUNT; i++)
    {
        cargo_snprintf(grpname, sizeof(grpname), "group%d", i+1);
        cargo_snprintf(title, sizeof(title), "The Group%d", i+1);
        ret |= cargo_add_group(cargo, 0, grpname, title, "Group");
        cargo_assert(ret == 0, "Failed to add group");

        for (j = 0; j < GROUP_OPT_COUNT; j++)
        {
            cargo_snprintf(optname, sizeof(optname), "--optg%02do%02d", i+1, j+1);
            ret |= cargo_add_option(cargo, 0, optname, LOREM_IPSUM, "i", &vals[i][j]);
            ret |= cargo_group_add_option(cargo, grpname, optname);
            cargo_assert(ret == 0, "Failed to add option");
        }
    }

    cargo_assert(ret == 0, "Failed to add groups");

    // Test to parse twice.
    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("%dx%d\n", data.width, data.height);
    cargo_assert(data.width == 128, "Width expected to be 128");
    cargo_assert(data.height == 64, "Height expected to be 128");
    cargo_assert(b == 1, "Expected b == 1");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("%dx%d\n", data.width, data.height);
    cargo_assert(data.width == 128, "Width expected to be 128");
    cargo_assert(data.height == 64, "Height expected to be 128");
    cargo_assert(b == 1, "Expected b == 1");

    _TEST_CLEANUP();
}